

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_astCompilationUnit *
new_function(Context_conflict *ctx,MOJOSHADER_astFunctionSignature *declaration,
            MOJOSHADER_astStatement *definition)

{
  MOJOSHADER_astCompilationUnit *pMVar1;
  
  pMVar1 = (MOJOSHADER_astCompilationUnit *)(*ctx->malloc)(0x38,ctx->malloc_data);
  if (pMVar1 == (MOJOSHADER_astCompilationUnit *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar1->ast).type = MOJOSHADER_AST_COMPUNIT_FUNCTION;
    (pMVar1->ast).filename = ctx->sourcefile;
    (pMVar1->ast).line = ctx->sourceline;
    pMVar1->next = (MOJOSHADER_astCompilationUnit *)0x0;
    *(MOJOSHADER_astFunctionSignature **)&pMVar1[1].ast = declaration;
    pMVar1[1].ast.filename = (char *)definition;
    pMVar1[1].ast.line = 0;
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_astCompilationUnit *new_function(Context *ctx,
                                MOJOSHADER_astFunctionSignature *declaration,
                                MOJOSHADER_astStatement *definition)
{
    NEW_AST_NODE(retval, MOJOSHADER_astCompilationUnitFunction,
                 MOJOSHADER_AST_COMPUNIT_FUNCTION);
    retval->next = NULL;
    retval->declaration = declaration;
    retval->definition = definition;
    retval->index = 0;
    return (MOJOSHADER_astCompilationUnit *) retval;
}